

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O1

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::set_scan_target
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this)

{
  pointer *this_00;
  ScanTarget *in_RSI;
  
  this_00 = (pointer *)
            ((long)&(this->z80_).super_ProcessorBase.super_ProcessorStorage.ddcb_page_.
                    fetch_decode_execute.
                    super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                    ._M_impl + 0x10);
  TI::TMS::TMS9918<(TI::TMS::Personality)4>::set_tv_standard
            ((TMS9918<(TI::TMS::Personality)4> *)this_00,
             (uint)(*(int *)&(this->super_AudioProducer)._vptr_AudioProducer != 2));
  TI::TMS::TMS9918<(TI::TMS::Personality)4>::set_scan_target
            ((TMS9918<(TI::TMS::Personality)4> *)this_00,in_RSI);
  return;
}

Assistant:

void set_scan_target(Outputs::Display::ScanTarget *scan_target) final {
			vdp_.last_valid()->set_tv_standard(
				(region_ == Target::Region::Europe) ?
					TI::TMS::TVStandard::PAL : TI::TMS::TVStandard::NTSC);

			// Doing the following would be technically correct, but isn't
			// especially thread-safe and won't make a substantial difference.
//			time_until_debounce_ = vdp_->get_time_until_line(-1);

			vdp_.last_valid()->set_scan_target(scan_target);
		}